

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_SimpleArray<ON_2fPoint>::Append(ON_SimpleArray<ON_2fPoint> *this,ON_2fPoint *x)

{
  int iVar1;
  ON_2fPoint *pOVar2;
  ON_2fPoint *pOVar3;
  
  iVar1 = this->m_count;
  pOVar2 = x;
  if (iVar1 == this->m_capacity) {
    iVar1 = NewCapacity(this);
    if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
      pOVar2 = (ON_2fPoint *)onmalloc(8);
      *pOVar2 = *x;
    }
    Reserve(this,(long)iVar1);
    pOVar3 = this->m_a;
    if (pOVar3 == (ON_2fPoint *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar1 = this->m_count;
  }
  else {
    pOVar3 = this->m_a;
  }
  this->m_count = iVar1 + 1;
  pOVar3[iVar1] = *pOVar2;
  if (pOVar2 != x) {
    onfree(pOVar2);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}